

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

size_t jessilib::make_map_start_action<char32_t,jessilib::json_context<char32_t,true>>
                 (json_context<char32_t,_true> *inout_context,
                 basic_string_view<char32_t,_std::char_traits<char32_t>_> *inout_read_view)

{
  char32_t *pcVar1;
  bool bVar2;
  size_t sVar3;
  mapped_type *out_object;
  invalid_argument *piVar4;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> *in_R8;
  size_t sVar5;
  undefined8 local_f8;
  char8_t *local_f0;
  char32_t local_e8 [2];
  char8_t *local_e0;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_d8;
  KeyContext<true> key_context;
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  local_a8;
  map_type result;
  
  result._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &result._M_t._M_impl.super__Rb_tree_header._M_header;
  result._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  result._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  result._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  result._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       result._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  advance_whitespace<char32_t>(inout_read_view);
  key_context.out_object._M_dataplus._M_p = (pointer)&key_context.out_object.field_2;
  key_context.out_object._M_string_length = 0;
  key_context.out_object.field_2._M_local_buf[0] = '\0';
  sVar5 = 0xffffffffffffffff;
  while (sVar3 = inout_read_view->_M_len, sVar3 != 0) {
    pcVar1 = inout_read_view->_M_str;
    if (*pcVar1 != L'\"') {
      if (*pcVar1 != L'}') {
        piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
        local_f8 = 0x26;
        local_f0 = "Invalid JSON data; unexpected token: \'";
        bVar2 = inout_read_view->_M_len != 0;
        if (bVar2) {
          local_d8._M_len._0_4_ = *inout_read_view->_M_str;
        }
        else {
          local_d8._M_len._0_4_ = L'\0';
        }
        local_d8._M_str = (char8_t *)(ulong)bVar2;
        local_e8[0] = L'0';
        local_e8[1] = L'\0';
        local_e0 = "\' when parsing object map (expected \'\"\' instead)";
        join_mbstring<std::basic_string_view<char8_t,std::char_traits<char8_t>>,char32_t,std::basic_string_view<char8_t,std::char_traits<char8_t>>>
                  ((string *)&local_a8,(jessilib *)&local_f8,&local_d8,local_e8,in_R8);
        std::invalid_argument::invalid_argument(piVar4,(string *)&local_a8);
        __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      inout_read_view->_M_str = pcVar1 + 1;
      inout_read_view->_M_len = sVar3 - 1;
      object::
      object<std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>,_nullptr>
                ((object *)&local_a8,&result);
      std::__detail::__variant::
      _Move_assign_base<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
      ::operator=((_Move_assign_base<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                   *)inout_context->out_object,
                  (_Move_assign_base<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                   *)&local_a8);
      std::__detail::__variant::
      _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
      ::~_Variant_storage(&local_a8);
      sVar5 = 1;
LAB_001b8d4c:
      std::__cxx11::u8string::~u8string((u8string *)&key_context);
      std::
      _Rb_tree<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
      ::~_Rb_tree(&result._M_t);
      return sVar5;
    }
    inout_read_view->_M_str = pcVar1 + 1;
    inout_read_view->_M_len = sVar3 - 1;
    sVar3 = string_start_action<char32_t,jessilib::KeyContext<true>>
                      ((KeyContext<true> *)&key_context.out_object,inout_read_view);
    if (sVar3 != 1) goto LAB_001b8d4c;
    advance_whitespace<char32_t>(inout_read_view);
    out_object = std::
                 map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
                 ::operator[](&result,&key_context.out_object);
    if (inout_read_view->_M_len == 0) {
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (piVar4,
                 "Invalid JSON data; unexpected end of data after parsing map key; expected \':\' followed by value"
                );
LAB_001b8e47:
      __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    if (*inout_read_view->_M_str != L':') {
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
      local_f8 = 0x26;
      local_f0 = "Invalid JSON data; unexpected token: \'";
      bVar2 = inout_read_view->_M_len != 0;
      if (bVar2) {
        local_d8._M_len._0_4_ = *inout_read_view->_M_str;
      }
      else {
        local_d8._M_len._0_4_ = L'\0';
      }
      local_d8._M_str = (char8_t *)(ulong)bVar2;
      local_e8[0] = L'-';
      local_e8[1] = L'\0';
      local_e0 = "\' when parsing map key (expected \':\' instead)";
      join_mbstring<std::basic_string_view<char8_t,std::char_traits<char8_t>>,char32_t,std::basic_string_view<char8_t,std::char_traits<char8_t>>>
                ((string *)&local_a8,(jessilib *)&local_f8,&local_d8,local_e8,in_R8);
      std::invalid_argument::invalid_argument(piVar4,(string *)&local_a8);
      __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    inout_read_view->_M_str = inout_read_view->_M_str + 1;
    inout_read_view->_M_len = inout_read_view->_M_len - 1;
    bVar2 = deserialize_json<char32_t,_true,_&jessilib::fail_action>(out_object,inout_read_view);
    if (!bVar2) break;
    advance_whitespace<char32_t>(inout_read_view);
    if (inout_read_view->_M_len == 0) {
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (piVar4,
                 "Invalid JSON data; unexpected end of data after parsing map value; expected \'}\'"
                );
      goto LAB_001b8e47;
    }
    if (*inout_read_view->_M_str == L',') {
      inout_read_view->_M_str = inout_read_view->_M_str + 1;
      inout_read_view->_M_len = inout_read_view->_M_len - 1;
      advance_whitespace<char32_t>(inout_read_view);
    }
  }
  piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (piVar4,
             "Invalid JSON data: unexpected end of data when parsing object array; expected \'}\'");
  __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

size_t make_map_start_action(ContextT& inout_context, std::basic_string_view<CharT>& inout_read_view) {
	using namespace std::literals;
	object::map_type result;

	advance_whitespace(inout_read_view);
	KeyContext<ContextT::use_exceptions> key_context;
	while (!inout_read_view.empty()) {
		// inout_read_view now points to either the start of a key, the end of the object, or invalid data
		CharT front = inout_read_view.front();
		if (front == '}') {
			// End of object
			inout_read_view.remove_prefix(1);
			inout_context.out_object = object{ std::move(result) }; // TODO: fix move semantics here
			return 1;
		}

		// Assert that we've reached the start of a key
		if (front != '\"') {
			if constexpr (ContextT::use_exceptions) {
				throw std::invalid_argument{
					jessilib::join_mbstring(u8"Invalid JSON data; unexpected token: '"sv,
					decode_codepoint(inout_read_view).codepoint,
					u8"' when parsing object map (expected '\"' instead)"sv) };
			}

			return std::numeric_limits<size_t>::max();
		}

		// Read in key
		inout_read_view.remove_prefix(1); // front quote
		// TODO: really should be using the escape sequencing method instead of this
		if (string_start_action<CharT, decltype(key_context)>(key_context, inout_read_view) != 1) {
			// Failed to find end of string; any exception would've been thrown in string_start_action
			return std::numeric_limits<size_t>::max();
		}
		advance_whitespace(inout_read_view);

		// Insert our value object
		auto& value = result[key_context.out_object];

		// Verify next character is ':'
		if (inout_read_view.empty()) {
			throw std::invalid_argument{
				"Invalid JSON data; unexpected end of data after parsing map key; expected ':' followed by value" };
		}
		front = inout_read_view.front();
		if (front != ':') {
			throw std::invalid_argument{
				jessilib::join_mbstring(u8"Invalid JSON data; unexpected token: '"sv,
				decode_codepoint(inout_read_view).codepoint,
				u8"' when parsing map key (expected ':' instead)"sv) };
		}
		inout_read_view.remove_prefix(1); // strip ':'

		// We've reached an object value; parse it
		if (!deserialize_json<CharT, ContextT::use_exceptions>(value, inout_read_view)) {
			// Invalid JSON! Any exception would've been thrown already
			break;
		}

		// Advance through whitespace to ',' or '}'
		advance_whitespace(inout_read_view);

		if (inout_read_view.empty()) {
			throw std::invalid_argument{
				"Invalid JSON data; unexpected end of data after parsing map value; expected '}'" };
		}

		if (inout_read_view.front() == ',') {
			// Strip comma and trailing whitespace
			inout_read_view.remove_prefix(1);
			advance_whitespace(inout_read_view);
		}
	}

	if constexpr (ContextT::use_exceptions) {
		throw std::invalid_argument{ "Invalid JSON data: unexpected end of data when parsing object array; expected '}'" };
	}

	return std::numeric_limits<size_t>::max();
}